

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsimplifier.h
# Opt level: O2

void __thiscall soplex::SPxSimplifier<double>::~SPxSimplifier(SPxSimplifier<double> *this)

{
  this->_vptr_SPxSimplifier = (_func_int **)&PTR__SPxSimplifier_0053e190;
  this->m_name = (char *)0x0;
  (**this->m_timeUsed->_vptr_Timer)();
  spx_free<soplex::Timer*>(&this->m_timeUsed);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

virtual ~SPxSimplifier()
   {
      m_name = nullptr;
      m_timeUsed->~Timer();
      spx_free(m_timeUsed);
   }